

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.c
# Opt level: O0

void clear_char(CHAR_DATA *ch)

{
  void *in_RDI;
  int i;
  int local_c;
  
  memcpy(in_RDI,&clear_char::ch_zero,0x340);
  *(char **)((long)in_RDI + 0xe8) = str_empty;
  *(char **)((long)in_RDI + 0x108) = str_empty;
  *(char **)((long)in_RDI + 0x110) = str_empty;
  *(char **)((long)in_RDI + 0x118) = str_empty;
  *(char **)((long)in_RDI + 0x120) = str_empty;
  *(undefined8 *)((long)in_RDI + 0x148) = _current_time;
  *(undefined4 *)((long)in_RDI + 0x140) = 0x14;
  for (local_c = 0; local_c < 4; local_c = local_c + 1) {
    *(undefined2 *)((long)in_RDI + (long)local_c * 2 + 0x20a) = 0;
  }
  *(undefined2 *)((long)in_RDI + 0x1f8) = 8;
  *(undefined4 *)((long)in_RDI + 0x158) = 0x14;
  *(undefined2 *)((long)in_RDI + 0x15c) = 0x14;
  *(undefined2 *)((long)in_RDI + 0x15e) = 100;
  *(undefined2 *)((long)in_RDI + 0x160) = 100;
  *(undefined2 *)((long)in_RDI + 0x162) = 100;
  *(undefined2 *)((long)in_RDI + 0x164) = 100;
  *(undefined8 *)((long)in_RDI + 0x38) = 0;
  *(undefined8 *)((long)in_RDI + 0x48) = 0;
  *(undefined8 *)((long)in_RDI + 0x50) = 0;
  *(undefined8 *)((long)in_RDI + 0xa0) = 0;
  *(undefined4 *)((long)in_RDI + 0x2f8) = 0;
  *(undefined2 *)((long)in_RDI + 0x304) = 2;
  *(undefined2 *)((long)in_RDI + 0x306) = 2;
  *(undefined2 *)((long)in_RDI + 0x308) = 0;
  *(undefined2 *)((long)in_RDI + 0x154) = 0;
  *(undefined2 *)((long)in_RDI + 0x2dc) = 0;
  return;
}

Assistant:

void clear_char(CHAR_DATA *ch)
{
	static CHAR_DATA ch_zero;
	int i;

	*ch = ch_zero;
	ch->name = &str_empty[0];
	ch->short_descr = &str_empty[0];
	ch->long_descr = &str_empty[0];
	ch->description = &str_empty[0];
	ch->prompt = &str_empty[0];
	ch->logon = current_time;
	ch->lines = PAGELEN;

	for (i = 0; i < 4; i++)
	{
		ch->armor[i] = 0;
	}

	ch->position = POS_STANDING;
	ch->hit = 20;
	ch->max_hit = 20;
	ch->mana = 100;
	ch->max_mana = 100;
	ch->move = 100;
	ch->max_move = 100;
	ch->last_fought = nullptr;
	ch->last_fight_time = 0;
	ch->last_fight_name = nullptr;
	ch->on = nullptr;
	ch->hometown = 0;
	ch->arms = 2;
	ch->legs = 2;
	ch->balance = 0;
	ch->regen_rate = 0;
	ch->ghost = 0;
}